

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O1

int ParseEXRMultipartHeaderFromFile
              (EXRHeader ***exr_headers,int *num_headers,EXRVersion *exr_version,char *filename,
              char **err)

{
  int iVar1;
  char *pcVar2;
  long *plVar3;
  long *plVar4;
  MemoryMappedFile file;
  allocator local_89;
  long *local_88;
  long local_80;
  long local_78;
  long lStack_70;
  MemoryMappedFile local_68;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  if ((exr_version == (EXRVersion *)0x0 ||
      (num_headers == (int *)0x0 || exr_headers == (EXRHeader ***)0x0)) || filename == (char *)0x0)
  {
    local_88 = &local_78;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_88,"Invalid argument for ParseEXRMultipartHeaderFromFile()","");
    if (err != (char **)0x0) {
      pcVar2 = strdup((char *)local_88);
      *err = pcVar2;
    }
    if (local_88 != &local_78) {
      operator_delete(local_88);
    }
    iVar1 = -3;
  }
  else {
    MemoryMappedFile::MemoryMappedFile(&local_68,filename);
    if (local_68.data == (uchar *)0x0) {
      std::__cxx11::string::string((string *)local_50,filename,&local_89);
      plVar3 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x2f4fd1);
      plVar4 = plVar3 + 2;
      if ((long *)*plVar3 == plVar4) {
        local_78 = *plVar4;
        lStack_70 = plVar3[3];
        local_88 = &local_78;
      }
      else {
        local_78 = *plVar4;
        local_88 = (long *)*plVar3;
      }
      local_80 = plVar3[1];
      *plVar3 = (long)plVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      if (err != (char **)0x0) {
        pcVar2 = strdup((char *)local_88);
        *err = pcVar2;
      }
      if (local_88 != &local_78) {
        operator_delete(local_88);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      iVar1 = -7;
    }
    else {
      iVar1 = ParseEXRMultipartHeaderFromMemory
                        (exr_headers,num_headers,exr_version,local_68.data,local_68.size,err);
    }
    MemoryMappedFile::~MemoryMappedFile(&local_68);
  }
  return iVar1;
}

Assistant:

int ParseEXRMultipartHeaderFromFile(EXRHeader ***exr_headers, int *num_headers,
                                    const EXRVersion *exr_version,
                                    const char *filename, const char **err) {
  if (exr_headers == NULL || num_headers == NULL || exr_version == NULL ||
      filename == NULL) {
    tinyexr::SetErrorMessage(
        "Invalid argument for ParseEXRMultipartHeaderFromFile()", err);
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

  MemoryMappedFile file(filename);
  if (!file.valid()) {
    tinyexr::SetErrorMessage("Cannot read file " + std::string(filename), err);
    return TINYEXR_ERROR_CANT_OPEN_FILE;
  }

  return ParseEXRMultipartHeaderFromMemory(
      exr_headers, num_headers, exr_version, file.data, file.size, err);
}